

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SNICallback_Test::TestBody
          (SSLVersionTest_SNICallback_Test *this)

{
  bool bVar1;
  char *pcVar2;
  pointer psVar3;
  X509 *pXVar4;
  EVP_PKEY *pkey;
  pointer arg;
  SSL *s;
  X509 *b;
  pointer psVar5;
  char *in_R9;
  AssertHelper local_428;
  Message local_420;
  Bytes local_418;
  Span<const_unsigned_char> local_408;
  Bytes local_3f8;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_2;
  Message local_3d0;
  Bytes local_3c8;
  Span<const_unsigned_char> local_3b8;
  Bytes local_3a8;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_1;
  size_t len;
  uint8_t *data;
  Message local_370;
  int local_368;
  int local_364;
  undefined1 local_360 [8];
  AssertionResult gtest_ar;
  AssertHelper local_330;
  Message local_328;
  undefined1 local_320 [8];
  AssertionResult gtest_ar__9;
  UniquePtr<X509> peer;
  AssertHelper local_2e8;
  Message local_2e0;
  ClientConfig local_2d8;
  bool local_279;
  undefined1 local_278 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_248;
  Message local_240;
  int local_234;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_200;
  Message local_1f8;
  int local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1b8;
  Message local_1b0;
  int local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_170;
  Message local_168;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_128;
  Message local_120;
  int local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<SSL_CTX> server_ctx2;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<EVP_PKEY> key2;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<X509> cert2;
  SSLVersionTest_SNICallback_Test *this_local;
  
  GetECDSATestCertificate();
  testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x4d8d31,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xfe0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    GetECDSATestKey();
    testing::AssertionResult::AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_88,
               (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_90);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&server_ctx2,(internal *)local_88,(AssertionResult *)"key2","false",
                 "true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xfe2,pcVar2);
      testing::internal::AssertHelper::operator=(&local_98,&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      std::__cxx11::string::~string((string *)&server_ctx2);
      testing::Message::~Message(&local_90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      SSLVersionTest::CreateContext((SSLVersionTest *)&gtest_ar__2.message_);
      testing::AssertionResult::AssertionResult<std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d0,
                 (unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,
                 (type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_d0,
                   (AssertionResult *)"server_ctx2","false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xfeb,pcVar2);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (bVar1) {
        psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_
                           );
        pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                    &gtest_ar_.message_);
        local_114 = SSL_CTX_use_certificate((SSL_CTX *)psVar3,pXVar4);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_110,&local_114,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_110,
                     (AssertionResult *)"SSL_CTX_use_certificate(server_ctx2.get(), cert2.get())",
                     "false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xfec,pcVar2);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_120);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
        if (bVar1) {
          psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                              &gtest_ar__2.message_);
          pkey = (EVP_PKEY *)
                 std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                            &gtest_ar__1.message_);
          local_15c = SSL_CTX_use_PrivateKey((SSL_CTX *)psVar3,pkey);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_158,&local_15c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
          if (!bVar1) {
            testing::Message::Message(&local_168);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_158,
                       (AssertionResult *)"SSL_CTX_use_PrivateKey(server_ctx2.get(), key2.get())",
                       "false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_170,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xfed,pcVar2);
            testing::internal::AssertHelper::operator=(&local_170,&local_168);
            testing::internal::AssertHelper::~AssertHelper(&local_170);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_168);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
          if (bVar1) {
            psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                &gtest_ar__2.message_);
            local_1a4 = SSL_CTX_set_signed_cert_timestamp_list(psVar3,"",8);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_1a0,&local_1a4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
            if (!bVar1) {
              testing::Message::Message(&local_1b0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_1a0,
                         (AssertionResult *)
                         "SSL_CTX_set_signed_cert_timestamp_list( server_ctx2.get(), kSCTList, sizeof(kSCTList))"
                         ,"false","true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1b8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xfef,pcVar2);
              testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
              testing::internal::AssertHelper::~AssertHelper(&local_1b8);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_1b0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
            if (bVar1) {
              psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__2.message_);
              local_1ec = SSL_CTX_set_ocsp_response(psVar3,"\x01\x02\x03\x04",4);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_1e8,&local_1ec,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
              if (!bVar1) {
                testing::Message::Message(&local_1f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_1e8,
                           (AssertionResult *)
                           "SSL_CTX_set_ocsp_response(server_ctx2.get(), kOCSPResponse, sizeof(kOCSPResponse))"
                           ,"false","true",in_R9);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_200,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xff1,pcVar2);
                testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
                testing::internal::AssertHelper::~AssertHelper(&local_200);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_1f8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
              if (bVar1) {
                psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__2.message_);
                local_234 = SSL_CTX_set_signing_algorithm_prefs
                                      (psVar3,&TestBody::kECDSAWithSHA256,1);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_230,&local_234,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_230);
                if (!bVar1) {
                  testing::Message::Message(&local_240);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar__8.message_,(internal *)local_230,
                             (AssertionResult *)
                             "SSL_CTX_set_signing_algorithm_prefs(server_ctx2.get(), &kECDSAWithSHA256, 1)"
                             ,"false","true",in_R9);
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_248,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0xff7,pcVar2);
                  testing::internal::AssertHelper::operator=(&local_248,&local_240);
                  testing::internal::AssertHelper::~AssertHelper(&local_248);
                  std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                  testing::Message::~Message(&local_240);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
                if (bVar1) {
                  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                     (&(this->super_SSLVersionTest).server_ctx_);
                  SSL_CTX_set_tlsext_servername_callback(psVar3,SwitchContext);
                  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                     (&(this->super_SSLVersionTest).server_ctx_);
                  arg = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                  ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)
                                   &gtest_ar__2.message_);
                  SSL_CTX_set_tlsext_servername_arg(psVar3,arg);
                  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                     (&(this->super_SSLVersionTest).client_ctx_);
                  SSL_CTX_enable_signed_cert_timestamps(psVar3);
                  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                                     (&(this->super_SSLVersionTest).client_ctx_);
                  SSL_CTX_enable_ocsp_stapling(psVar3);
                  local_2d8.verify_hostname.field_2._M_allocated_capacity = 0;
                  local_2d8.verify_hostname.field_2._8_8_ = 0;
                  local_2d8.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
                  local_2d8.verify_hostname._1_7_ = 0;
                  local_2d8.verify_hostname._M_string_length = 0;
                  local_2d8.servername.field_2._M_allocated_capacity = 0;
                  local_2d8.servername.field_2._8_8_ = 0;
                  local_2d8.servername._M_dataplus = (_Alloc_hider)0x0;
                  local_2d8.servername._1_7_ = 0;
                  local_2d8.servername._M_string_length = 0;
                  local_2d8.session = (SSL_SESSION *)0x0;
                  local_2d8.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
                  local_2d8.hostflags = 0;
                  local_2d8.early_data = false;
                  local_2d8._85_3_ = 0;
                  ClientConfig::ClientConfig(&local_2d8);
                  local_279 = SSLVersionTest::Connect(&this->super_SSLVersionTest,&local_2d8);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_278,&local_279,(type *)0x0);
                  ClientConfig::~ClientConfig(&local_2d8);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_278);
                  if (!bVar1) {
                    testing::Message::Message(&local_2e0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&peer,(internal *)local_278,(AssertionResult *)"Connect()",
                               "false","true",in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_2e8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0xfff,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
                    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
                    std::__cxx11::string::~string((string *)&peer);
                    testing::Message::~Message(&local_2e0);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
                  if (bVar1) {
                    s = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                         (&(this->super_SSLVersionTest).client_);
                    pXVar4 = SSL_get_peer_certificate(s);
                    std::unique_ptr<x509_st,bssl::internal::Deleter>::
                    unique_ptr<bssl::internal::Deleter,void>
                              ((unique_ptr<x509_st,bssl::internal::Deleter> *)&gtest_ar__9.message_,
                               (pointer)pXVar4);
                    testing::AssertionResult::
                    AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                              ((AssertionResult *)local_320,
                               (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__9.message_
                               ,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_320);
                    if (!bVar1) {
                      testing::Message::Message(&local_328);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar.message_,(internal *)local_320,
                                 (AssertionResult *)"peer","false","true",in_R9);
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_330,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x1003,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_330,&local_328);
                      testing::internal::AssertHelper::~AssertHelper(&local_330);
                      std::__cxx11::string::~string((string *)&gtest_ar.message_);
                      testing::Message::~Message(&local_328);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
                    if (bVar1) {
                      pXVar4 = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                                  &gtest_ar__9.message_);
                      b = (X509 *)std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                             &gtest_ar_.message_);
                      local_364 = X509_cmp(pXVar4,b);
                      local_368 = 0;
                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                ((EqHelper *)local_360,"X509_cmp(peer.get(), cert2.get())","0",
                                 &local_364,&local_368);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_360);
                      if (!bVar1) {
                        testing::Message::Message(&local_370);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_360);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&data,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x1004,pcVar2);
                        testing::internal::AssertHelper::operator=((AssertHelper *)&data,&local_370)
                        ;
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&data);
                        testing::Message::~Message(&local_370);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
                      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                         (&(this->super_SSLVersionTest).client_);
                      SSL_get0_signed_cert_timestamp_list
                                (psVar5,(uint8_t **)&len,(size_t *)&gtest_ar_1.message_);
                      Span<unsigned_char_const>::Span<8ul>
                                ((Span<unsigned_char_const> *)&local_3b8,(uchar (*) [8])"");
                      Bytes::Bytes(&local_3a8,local_3b8);
                      Bytes::Bytes(&local_3c8,(uint8_t *)len,
                                   (size_t)gtest_ar_1.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl);
                      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                ((EqHelper *)local_398,"Bytes(kSCTList)","Bytes(data, len)",
                                 &local_3a8,&local_3c8);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_398);
                      if (!bVar1) {
                        testing::Message::Message(&local_3d0);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_398);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x100a,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_2.message_,&local_3d0);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_2.message_);
                        testing::Message::~Message(&local_3d0);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
                      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                         (&(this->super_SSLVersionTest).client_);
                      SSL_get0_ocsp_response(psVar5,(uint8_t **)&len,(size_t *)&gtest_ar_1.message_)
                      ;
                      Span<unsigned_char_const>::Span<4ul>
                                ((Span<unsigned_char_const> *)&local_408,
                                 (uchar (*) [4])"\x01\x02\x03\x04");
                      Bytes::Bytes(&local_3f8,local_408);
                      Bytes::Bytes(&local_418,(uint8_t *)len,
                                   (size_t)gtest_ar_1.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl);
                      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                ((EqHelper *)local_3e8,"Bytes(kOCSPResponse)","Bytes(data, len)",
                                 &local_3f8,&local_418);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_3e8);
                      if (!bVar1) {
                        testing::Message::Message(&local_420);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_3e8);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_428,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x100e,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_428,&local_420);
                        testing::internal::AssertHelper::~AssertHelper(&local_428);
                        testing::Message::~Message(&local_420);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
                    }
                    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__9.message_
                              );
                  }
                }
              }
            }
          }
        }
      }
      std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_P(SSLVersionTest, SNICallback) {
  bssl::UniquePtr<X509> cert2 = GetECDSATestCertificate();
  ASSERT_TRUE(cert2);
  bssl::UniquePtr<EVP_PKEY> key2 = GetECDSATestKey();
  ASSERT_TRUE(key2);

  // Test that switching the |SSL_CTX| at the SNI callback behaves correctly.
  static const uint16_t kECDSAWithSHA256 = SSL_SIGN_ECDSA_SECP256R1_SHA256;

  static const uint8_t kSCTList[] = {0, 6, 0, 4, 5, 6, 7, 8};
  static const uint8_t kOCSPResponse[] = {1, 2, 3, 4};

  bssl::UniquePtr<SSL_CTX> server_ctx2 = CreateContext();
  ASSERT_TRUE(server_ctx2);
  ASSERT_TRUE(SSL_CTX_use_certificate(server_ctx2.get(), cert2.get()));
  ASSERT_TRUE(SSL_CTX_use_PrivateKey(server_ctx2.get(), key2.get()));
  ASSERT_TRUE(SSL_CTX_set_signed_cert_timestamp_list(
      server_ctx2.get(), kSCTList, sizeof(kSCTList)));
  ASSERT_TRUE(SSL_CTX_set_ocsp_response(server_ctx2.get(), kOCSPResponse,
                                        sizeof(kOCSPResponse)));
  // Historically signing preferences would be lost in some cases with the
  // SNI callback, which triggers the TLS 1.2 SHA-1 default. To ensure
  // this doesn't happen when |version| is TLS 1.2, configure the private
  // key to only sign SHA-256.
  ASSERT_TRUE(SSL_CTX_set_signing_algorithm_prefs(server_ctx2.get(),
                                                  &kECDSAWithSHA256, 1));

  SSL_CTX_set_tlsext_servername_callback(server_ctx_.get(), SwitchContext);
  SSL_CTX_set_tlsext_servername_arg(server_ctx_.get(), server_ctx2.get());

  SSL_CTX_enable_signed_cert_timestamps(client_ctx_.get());
  SSL_CTX_enable_ocsp_stapling(client_ctx_.get());

  ASSERT_TRUE(Connect());

  // The client should have received |cert2|.
  bssl::UniquePtr<X509> peer(SSL_get_peer_certificate(client_.get()));
  ASSERT_TRUE(peer);
  EXPECT_EQ(X509_cmp(peer.get(), cert2.get()), 0);

  // The client should have received |server_ctx2|'s SCT list.
  const uint8_t *data;
  size_t len;
  SSL_get0_signed_cert_timestamp_list(client_.get(), &data, &len);
  EXPECT_EQ(Bytes(kSCTList), Bytes(data, len));

  // The client should have received |server_ctx2|'s OCSP response.
  SSL_get0_ocsp_response(client_.get(), &data, &len);
  EXPECT_EQ(Bytes(kOCSPResponse), Bytes(data, len));
}